

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::MetaVariable::get_value<std::__cxx11::string>
          (MetaVariable *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dst
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dst_local;
  MetaVariable *this_local;
  
  if (dst == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pbVar1 = tinyusdz::value::Value::as<std::__cxx11::string>(&this->_value,false);
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      std::__cxx11::string::operator=((string *)dst,(string *)pbVar1);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *dst) const {
    if (!dst) {
      return false;
    }

    if (const T *v = _value.as<T>()) {
      (*dst) = *v;
      return true;
    }

    return false;
  }